

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O3

bool __thiscall cmCTestSVN::NoteNewRevision(cmCTestSVN *this)

{
  cmCTest *this_00;
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  pointer svninfo;
  ostringstream cmCTestLog_msg;
  string local_1d8;
  cmCTestSVN *local_1b8;
  pointer local_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  bVar1 = LoadRepositories(this);
  if (bVar1) {
    svninfo = (this->Repositories).
              super__Vector_base<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_1b0 = (this->Repositories).
                super__Vector_base<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    if (svninfo != local_1b0) {
      local_1b8 = this;
      do {
        LoadInfo_abi_cxx11_(local_1a8,this,svninfo);
        std::__cxx11::string::operator=((string *)&svninfo->NewRevision,(string *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        poVar3 = (this->super_cmCTestGlobalVC).super_cmCTestVC.Log;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Revision for repository \'",0x19)
        ;
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(svninfo->LocalPath)._M_dataplus._M_p,
                            (svninfo->LocalPath)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\' after update: ",0x10);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(svninfo->NewRevision)._M_dataplus._M_p,
                            (svninfo->NewRevision)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"   New revision of external repository \'",0x28);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(svninfo->LocalPath)._M_dataplus._M_p,
                            (svninfo->LocalPath)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\' is: ",6);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(svninfo->NewRevision)._M_dataplus._M_p,
                            (svninfo->NewRevision)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        this_00 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(this_00,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestSVN.cxx"
                     ,0x8b,local_1d8._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        poVar3 = (this->super_cmCTestGlobalVC).super_cmCTestVC.Log;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Repository \'",0xc);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(svninfo->LocalPath)._M_dataplus._M_p,
                            (svninfo->LocalPath)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\' URL = ",8);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(svninfo->URL)._M_dataplus._M_p,(svninfo->URL)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        poVar3 = (this->super_cmCTestGlobalVC).super_cmCTestVC.Log;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Repository \'",0xc);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(svninfo->LocalPath)._M_dataplus._M_p,
                            (svninfo->LocalPath)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\' Root = ",9);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(svninfo->Root)._M_dataplus._M_p,(svninfo->Root)._M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        if ((svninfo->Root)._M_string_length != 0) {
          bVar2 = cmCTestSVNPathStarts
                            ((string *)(svninfo->URL)._M_dataplus._M_p,
                             (string *)(svninfo->URL)._M_string_length);
          if (bVar2) {
            std::__cxx11::string::substr((ulong)&local_1d8,(ulong)&svninfo->URL);
            cmCTest::DecodeURL(local_1a8,&local_1d8);
            std::__cxx11::string::operator=((string *)&svninfo->Base,(string *)local_1a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
              operator_delete(local_1a8[0]._M_dataplus._M_p,
                              local_1a8[0].field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
              operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::string::append((char *)&svninfo->Base);
            this = local_1b8;
          }
        }
        poVar3 = (this->super_cmCTestGlobalVC).super_cmCTestVC.Log;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Repository \'",0xc);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(svninfo->LocalPath)._M_dataplus._M_p,
                            (svninfo->LocalPath)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\' Base = ",9);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(svninfo->Base)._M_dataplus._M_p,(svninfo->Base)._M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        svninfo = svninfo + 1;
      } while (svninfo != local_1b0);
    }
    std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).NewRevision);
  }
  return bVar1;
}

Assistant:

bool cmCTestSVN::NoteNewRevision()
{
  if (!this->LoadRepositories()) {
    return false;
  }

  std::vector<SVNInfo>::iterator itbeg = this->Repositories.begin();
  std::vector<SVNInfo>::iterator itend = this->Repositories.end();
  for (; itbeg != itend; itbeg++) {
    SVNInfo& svninfo = *itbeg;
    svninfo.NewRevision = this->LoadInfo(svninfo);
    this->Log << "Revision for repository '" << svninfo.LocalPath
              << "' after update: " << svninfo.NewRevision << "\n";
    cmCTestLog(
      this->CTest, HANDLER_OUTPUT, "   New revision of external repository '"
        << svninfo.LocalPath << "' is: " << svninfo.NewRevision << "\n");

    // svninfo.Root = ""; // uncomment to test GuessBase
    this->Log << "Repository '" << svninfo.LocalPath
              << "' URL = " << svninfo.URL << "\n";
    this->Log << "Repository '" << svninfo.LocalPath
              << "' Root = " << svninfo.Root << "\n";

    // Compute the base path the working tree has checked out under
    // the repository root.
    if (!svninfo.Root.empty() &&
        cmCTestSVNPathStarts(svninfo.URL, svninfo.Root)) {
      svninfo.Base =
        cmCTest::DecodeURL(svninfo.URL.substr(svninfo.Root.size()));
      svninfo.Base += "/";
    }
    this->Log << "Repository '" << svninfo.LocalPath
              << "' Base = " << svninfo.Base << "\n";
  }

  // Set the global new revision to the one of the root
  this->NewRevision = this->RootInfo->NewRevision;
  return true;
}